

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Swish_x86_avx2::forward_inplace(Swish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  int iVar8;
  ulong uVar9;
  uint uVar10;
  undefined1 (*pauVar11) [16];
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  undefined1 auVar22 [32];
  undefined1 auVar17 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar25 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_02 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar43 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar45 [36];
  undefined1 auVar44 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar77 [16];
  undefined1 auVar80 [64];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 local_148 [16];
  float local_108;
  undefined1 auVar21 [32];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  uVar12 = bottom_top_blob->c;
  uVar14 = (ulong)uVar12;
  uVar13 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar12) {
      uVar9 = 0;
      auVar41._8_4_ = 0x42b0c0a5;
      auVar41._0_8_ = 0x42b0c0a542b0c0a5;
      auVar41._12_4_ = 0x42b0c0a5;
      auVar41._16_4_ = 0x42b0c0a5;
      auVar41._20_4_ = 0x42b0c0a5;
      auVar41._24_4_ = 0x42b0c0a5;
      auVar41._28_4_ = 0x42b0c0a5;
      auVar43 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                   CONCAT424(0xc2b0c0a5,
                                             CONCAT420(0xc2b0c0a5,
                                                       CONCAT416(0xc2b0c0a5,
                                                                 CONCAT412(0xc2b0c0a5,
                                                                           CONCAT48(0xc2b0c0a5,
                                                                                                                                                                        
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar88 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                   CONCAT424(0x3fb8aa3b,
                                             CONCAT420(0x3fb8aa3b,
                                                       CONCAT416(0x3fb8aa3b,
                                                                 CONCAT412(0x3fb8aa3b,
                                                                           CONCAT48(0x3fb8aa3b,
                                                                                                                                                                        
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar56 = ZEXT3264(CONCAT428(0x3f000000,
                                   CONCAT424(0x3f000000,
                                             CONCAT420(0x3f000000,
                                                       CONCAT416(0x3f000000,
                                                                 CONCAT412(0x3f000000,
                                                                           CONCAT48(0x3f000000,
                                                                                                                                                                        
                                                  0x3f0000003f000000)))))));
      auVar80 = ZEXT3264(CONCAT428(0x3f800000,
                                   CONCAT424(0x3f800000,
                                             CONCAT420(0x3f800000,
                                                       CONCAT416(0x3f800000,
                                                                 CONCAT412(0x3f800000,
                                                                           CONCAT48(0x3f800000,
                                                                                                                                                                        
                                                  0x3f8000003f800000)))))));
      auVar34._8_4_ = 0xbf317218;
      auVar34._0_8_ = 0xbf317218bf317218;
      auVar34._12_4_ = 0xbf317218;
      auVar34._16_4_ = 0xbf317218;
      auVar34._20_4_ = 0xbf317218;
      auVar34._24_4_ = 0xbf317218;
      auVar34._28_4_ = 0xbf317218;
      auVar58._8_4_ = 0x3f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      auVar58._12_4_ = 0x3f800000;
      auVar58._16_4_ = 0x3f800000;
      auVar58._20_4_ = 0x3f800000;
      auVar58._24_4_ = 0x3f800000;
      auVar58._28_4_ = 0x3f800000;
      do {
        auVar75._8_4_ = 0x3c088908;
        auVar75._0_8_ = 0x3c0889083c088908;
        auVar75._12_4_ = 0x3c088908;
        auVar75._16_4_ = 0x3c088908;
        auVar75._20_4_ = 0x3c088908;
        auVar75._24_4_ = 0x3c088908;
        auVar75._28_4_ = 0x3c088908;
        auVar20._8_4_ = 0x3d2aa9c1;
        auVar20._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar20._12_4_ = 0x3d2aa9c1;
        auVar20._16_4_ = 0x3d2aa9c1;
        auVar20._20_4_ = 0x3d2aa9c1;
        auVar20._24_4_ = 0x3d2aa9c1;
        auVar20._28_4_ = 0x3d2aa9c1;
        auVar72._8_4_ = 0x3e2aaaaa;
        auVar72._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar72._12_4_ = 0x3e2aaaaa;
        auVar72._16_4_ = 0x3e2aaaaa;
        auVar72._20_4_ = 0x3e2aaaaa;
        auVar72._24_4_ = 0x3e2aaaaa;
        auVar72._28_4_ = 0x3e2aaaaa;
        if (0 < (int)uVar13) {
          pauVar15 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar23 = auVar80;
          uVar12 = uVar13;
          do {
            auVar32 = *pauVar15;
            auVar85._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
            auVar85._8_4_ = -auVar32._8_4_;
            auVar85._12_4_ = -auVar32._12_4_;
            auVar85._16_4_ = -auVar32._16_4_;
            auVar85._20_4_ = -auVar32._20_4_;
            auVar85._24_4_ = -auVar32._24_4_;
            auVar85._28_4_ = auVar32._28_4_ ^ 0x80000000;
            auVar31 = vminps_avx(auVar85,auVar41);
            auVar30 = vmaxps_avx(auVar31,auVar43._0_32_);
            auVar54 = auVar56._0_32_;
            auVar68 = vfmadd213ps_fma(auVar88._0_32_,auVar30,auVar54);
            auVar85 = vroundps_avx(ZEXT1632(auVar68),1);
            auVar31 = vcmpps_avx(ZEXT1632(auVar68),auVar85,1);
            auVar78 = auVar23._0_32_;
            auVar31 = vandps_avx(auVar31,auVar78);
            auVar85 = vsubps_avx(auVar85,auVar31);
            auVar28 = vfmadd231ps_fma(auVar30,auVar85,auVar34);
            auVar30 = ZEXT1632(auVar28);
            fVar1 = auVar28._0_4_;
            fVar2 = auVar28._4_4_;
            fVar3 = auVar28._8_4_;
            fVar4 = auVar28._12_4_;
            auVar31._28_4_ = auVar31._28_4_;
            auVar31._0_28_ =
                 ZEXT1628(CONCAT412(fVar4 * fVar4,
                                    CONCAT48(fVar3 * fVar3,CONCAT44(fVar2 * fVar2,fVar1 * fVar1))));
            auVar66._8_4_ = 0x39506967;
            auVar66._0_8_ = 0x3950696739506967;
            auVar66._12_4_ = 0x39506967;
            auVar66._16_4_ = 0x39506967;
            auVar66._20_4_ = 0x39506967;
            auVar66._24_4_ = 0x39506967;
            auVar66._28_4_ = 0x39506967;
            auVar76._8_4_ = 0x3ab743ce;
            auVar76._0_8_ = 0x3ab743ce3ab743ce;
            auVar76._12_4_ = 0x3ab743ce;
            auVar76._16_4_ = 0x3ab743ce;
            auVar76._20_4_ = 0x3ab743ce;
            auVar76._24_4_ = 0x3ab743ce;
            auVar76._28_4_ = 0x3ab743ce;
            auVar68 = vfmadd213ps_fma(auVar66,auVar30,auVar76);
            auVar56 = ZEXT3264(auVar54);
            auVar80 = ZEXT3264(auVar78);
            auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar30,auVar75);
            auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar30,auVar20);
            auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar28),auVar72);
            auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar28),auVar54);
            auVar54._0_4_ = fVar1 + auVar23._0_4_;
            auVar54._4_4_ = fVar2 + auVar23._4_4_;
            auVar54._8_4_ = fVar3 + auVar23._8_4_;
            auVar54._12_4_ = fVar4 + auVar23._12_4_;
            auVar54._16_4_ = auVar23._16_4_ + 0.0;
            auVar54._20_4_ = auVar23._20_4_ + 0.0;
            auVar54._24_4_ = auVar23._24_4_ + 0.0;
            auVar54._28_4_ = auVar23._28_4_ + 0.0;
            auVar68 = vfmadd231ps_fma(auVar54,auVar31,ZEXT1632(auVar68));
            auVar88 = ZEXT3264(auVar88._0_32_);
            auVar30._0_4_ = (int)auVar85._0_4_;
            auVar30._4_4_ = (int)auVar85._4_4_;
            auVar30._8_4_ = (int)auVar85._8_4_;
            auVar30._12_4_ = (int)auVar85._12_4_;
            auVar30._16_4_ = (int)auVar85._16_4_;
            auVar30._20_4_ = (int)auVar85._20_4_;
            auVar30._24_4_ = (int)auVar85._24_4_;
            auVar30._28_4_ = (int)auVar85._28_4_;
            auVar31 = vpslld_avx2(auVar30,0x17);
            auVar31 = vpaddd_avx2(auVar31,auVar58);
            auVar68 = vfmadd213ps_fma(auVar31,ZEXT1632(auVar68),auVar78);
            auVar31 = vrcpps_avx(ZEXT1632(auVar68));
            auVar78._0_4_ = auVar32._0_4_ * auVar31._0_4_;
            auVar78._4_4_ = auVar32._4_4_ * auVar31._4_4_;
            auVar78._8_4_ = auVar32._8_4_ * auVar31._8_4_;
            auVar78._12_4_ = auVar32._12_4_ * auVar31._12_4_;
            auVar78._16_4_ = auVar32._16_4_ * auVar31._16_4_;
            auVar78._20_4_ = auVar32._20_4_ * auVar31._20_4_;
            auVar78._24_4_ = auVar32._24_4_ * auVar31._24_4_;
            auVar78._28_4_ = 0;
            auVar68 = vfmsub213ps_fma(ZEXT1632(auVar68),auVar78,auVar32);
            auVar68 = vfnmadd213ps_fma(ZEXT1632(auVar68),auVar31,auVar78);
            *pauVar15 = ZEXT1632(auVar68);
            auVar43 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                         CONCAT424(0xc2b0c0a5,
                                                   CONCAT420(0xc2b0c0a5,
                                                             CONCAT416(0xc2b0c0a5,
                                                                       CONCAT412(0xc2b0c0a5,
                                                                                 CONCAT48(0xc2b0c0a5
                                                                                          ,
                                                  0xc2b0c0a5c2b0c0a5)))))));
            pauVar15 = pauVar15 + 1;
            uVar12 = uVar12 - 1;
            auVar23 = auVar80;
          } while (uVar12 != 0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar14);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar12) {
      uVar9 = 0;
      auVar59._8_4_ = 0x42b0c0a5;
      auVar59._0_8_ = 0x42b0c0a542b0c0a5;
      auVar59._12_4_ = 0x42b0c0a5;
      auVar43 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
      auVar88 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
      auVar56 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar80 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar46._8_4_ = 0xbf317218;
      auVar46._0_8_ = 0xbf317218bf317218;
      auVar46._12_4_ = 0xbf317218;
      auVar57._8_4_ = 0x3f800000;
      auVar57._0_8_ = 0x3f8000003f800000;
      auVar57._12_4_ = 0x3f800000;
      do {
        auVar73._8_4_ = 0x3c088908;
        auVar73._0_8_ = 0x3c0889083c088908;
        auVar73._12_4_ = 0x3c088908;
        auVar69._8_4_ = 0x3d2aa9c1;
        auVar69._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar69._12_4_ = 0x3d2aa9c1;
        auVar71._8_4_ = 0x3e2aaaaa;
        auVar71._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar71._12_4_ = 0x3e2aaaaa;
        if (0 < (int)uVar13) {
          pauVar11 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar23 = auVar80;
          uVar12 = uVar13;
          do {
            auVar68 = *pauVar11;
            auVar82._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
            auVar82._8_4_ = -auVar68._8_4_;
            auVar82._12_4_ = -auVar68._12_4_;
            auVar28 = vminps_avx(auVar82,auVar59);
            auVar53 = vmaxps_avx(auVar28,auVar43._0_16_);
            auVar52 = auVar56._0_16_;
            auVar28 = vfmadd213ps_fma(auVar88._0_16_,auVar53,auVar52);
            auVar26._0_4_ = (int)auVar28._0_4_;
            auVar26._4_4_ = (int)auVar28._4_4_;
            auVar26._8_4_ = (int)auVar28._8_4_;
            auVar26._12_4_ = (int)auVar28._12_4_;
            auVar25 = vcvtdq2ps_avx(auVar26);
            auVar28 = vcmpps_avx(auVar28,auVar25,1);
            auVar77 = auVar23._0_16_;
            auVar28 = vandps_avx(auVar28,auVar77);
            auVar28 = vsubps_avx(auVar25,auVar28);
            auVar53 = vfmadd231ps_fma(auVar53,auVar28,auVar46);
            fVar1 = auVar53._0_4_;
            auVar86._0_4_ = fVar1 * fVar1;
            fVar2 = auVar53._4_4_;
            auVar86._4_4_ = fVar2 * fVar2;
            fVar3 = auVar53._8_4_;
            auVar86._8_4_ = fVar3 * fVar3;
            fVar4 = auVar53._12_4_;
            auVar86._12_4_ = fVar4 * fVar4;
            auVar62._8_4_ = 0x39506967;
            auVar62._0_8_ = 0x3950696739506967;
            auVar62._12_4_ = 0x39506967;
            auVar74._8_4_ = 0x3ab743ce;
            auVar74._0_8_ = 0x3ab743ce3ab743ce;
            auVar74._12_4_ = 0x3ab743ce;
            auVar25 = vfmadd213ps_fma(auVar62,auVar53,auVar74);
            auVar56 = ZEXT1664(auVar52);
            auVar80 = ZEXT1664(auVar77);
            auVar25 = vfmadd213ps_fma(auVar25,auVar53,auVar73);
            auVar25 = vfmadd213ps_fma(auVar25,auVar53,auVar69);
            auVar25 = vfmadd213ps_fma(auVar25,auVar53,auVar71);
            auVar25 = vfmadd213ps_fma(auVar25,auVar53,auVar52);
            auVar83._0_4_ = fVar1 + auVar23._0_4_;
            auVar83._4_4_ = fVar2 + auVar23._4_4_;
            auVar83._8_4_ = fVar3 + auVar23._8_4_;
            auVar83._12_4_ = fVar4 + auVar23._12_4_;
            auVar25 = vfmadd231ps_fma(auVar83,auVar86,auVar25);
            auVar88 = ZEXT1664(auVar88._0_16_);
            auVar27._0_4_ = (int)auVar28._0_4_;
            auVar27._4_4_ = (int)auVar28._4_4_;
            auVar27._8_4_ = (int)auVar28._8_4_;
            auVar27._12_4_ = (int)auVar28._12_4_;
            auVar28 = vpslld_avx(auVar27,0x17);
            auVar28 = vpaddd_avx(auVar28,auVar57);
            auVar25 = vfmadd213ps_fma(auVar28,auVar25,auVar77);
            auVar28 = vrcpps_avx(auVar25);
            auVar84._0_4_ = auVar68._0_4_ * auVar28._0_4_;
            auVar84._4_4_ = auVar68._4_4_ * auVar28._4_4_;
            auVar84._8_4_ = auVar68._8_4_ * auVar28._8_4_;
            auVar84._12_4_ = auVar68._12_4_ * auVar28._12_4_;
            auVar68 = vfmsub213ps_fma(auVar25,auVar84,auVar68);
            auVar68 = vfnmadd213ps_fma(auVar68,auVar28,auVar84);
            *pauVar11 = auVar68;
            auVar43 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            pauVar11 = pauVar11 + 1;
            uVar12 = uVar12 - 1;
            auVar23 = auVar80;
          } while (uVar12 != 0);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar14);
    }
  }
  else if (0 < (int)uVar12) {
    uVar9 = 0;
    auVar43 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    do {
      auVar81._8_4_ = 0x3d2aa9c1;
      auVar81._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar79._8_4_ = 0xbf317218;
      auVar79._0_8_ = 0xbf317218bf317218;
      auVar70._8_4_ = 0x3f000000;
      auVar70._0_8_ = 0x3f0000003f000000;
      auVar67._8_4_ = 0x3c088908;
      auVar67._0_8_ = 0x3c0889083c088908;
      auVar60._8_4_ = 0x42b0c0a5;
      auVar60._0_8_ = 0x42b0c0a542b0c0a5;
      auVar51._8_4_ = 0x3fb8aa3b;
      auVar51._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar39._8_4_ = 0xc2b0c0a5;
      auVar39._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar32._8_4_ = 0x3ab743ce;
      auVar32._0_8_ = 0x3ab743ce3ab743ce;
      auVar81._12_4_ = 0x3d2aa9c1;
      auVar79._12_4_ = 0xbf317218;
      auVar70._12_4_ = 0x3f000000;
      auVar67._12_4_ = 0x3c088908;
      auVar60._12_4_ = 0x42b0c0a5;
      auVar51._12_4_ = 0x3fb8aa3b;
      auVar39._12_4_ = 0xc2b0c0a5;
      auVar32._12_4_ = 0x3ab743ce;
      auVar81._16_4_ = 0x3d2aa9c1;
      auVar79._16_4_ = 0xbf317218;
      auVar70._16_4_ = 0x3f000000;
      auVar67._16_4_ = 0x3c088908;
      auVar60._16_4_ = 0x42b0c0a5;
      auVar51._16_4_ = 0x3fb8aa3b;
      auVar39._16_4_ = 0xc2b0c0a5;
      auVar32._16_4_ = 0x3ab743ce;
      auVar81._20_4_ = 0x3d2aa9c1;
      auVar79._20_4_ = 0xbf317218;
      auVar70._20_4_ = 0x3f000000;
      auVar67._20_4_ = 0x3c088908;
      auVar60._20_4_ = 0x42b0c0a5;
      auVar51._20_4_ = 0x3fb8aa3b;
      auVar39._20_4_ = 0xc2b0c0a5;
      auVar32._20_4_ = 0x3ab743ce;
      auVar34 = in_ZMM4._0_32_;
      auVar81._24_4_ = 0x3d2aa9c1;
      auVar79._24_4_ = 0xbf317218;
      auVar70._24_4_ = 0x3f000000;
      auVar67._24_4_ = 0x3c088908;
      auVar60._24_4_ = 0x42b0c0a5;
      auVar51._24_4_ = 0x3fb8aa3b;
      auVar39._24_4_ = 0xc2b0c0a5;
      auVar32._24_4_ = 0x3ab743ce;
      auVar81._28_4_ = 0x3d2aa9c1;
      auVar79._28_4_ = 0xbf317218;
      auVar70._28_4_ = 0x3f000000;
      auVar67._28_4_ = 0x3c088908;
      auVar60._28_4_ = 0x42b0c0a5;
      auVar51._28_4_ = 0x3fb8aa3b;
      auVar39._28_4_ = 0xc2b0c0a5;
      auVar32._28_4_ = 0x3ab743ce;
      pauVar15 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar13 < 8) {
        uVar12 = 0;
      }
      else {
        iVar8 = 7;
        do {
          auVar58 = *pauVar15;
          auVar33._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
          auVar33._8_4_ = -auVar58._8_4_;
          auVar33._12_4_ = -auVar58._12_4_;
          auVar33._16_4_ = -auVar58._16_4_;
          auVar33._20_4_ = -auVar58._20_4_;
          auVar33._24_4_ = -auVar58._24_4_;
          auVar33._28_4_ = auVar58._28_4_ ^ 0x80000000;
          auVar34 = vminps_avx(auVar33,auVar60);
          auVar41 = vmaxps_avx(auVar34,auVar39);
          auVar68 = vfmadd213ps_fma(auVar51,auVar41,auVar70);
          auVar20 = vroundps_avx(ZEXT1632(auVar68),1);
          auVar34 = vcmpps_avx(ZEXT1632(auVar68),auVar20,1);
          auVar34 = vandps_avx(auVar43._0_32_,auVar34);
          auVar72 = vsubps_avx(auVar20,auVar34);
          auVar28 = vfmadd231ps_fma(auVar41,auVar72,auVar79);
          auVar34 = ZEXT1632(auVar28);
          fVar1 = auVar28._0_4_;
          fVar2 = auVar28._4_4_;
          fVar3 = auVar28._8_4_;
          fVar4 = auVar28._12_4_;
          auVar5._28_4_ = auVar20._28_4_;
          auVar5._0_28_ =
               ZEXT1628(CONCAT412(fVar4 * fVar4,
                                  CONCAT48(fVar3 * fVar3,CONCAT44(fVar2 * fVar2,fVar1 * fVar1))));
          auVar55._8_4_ = 0x39506967;
          auVar55._0_8_ = 0x3950696739506967;
          auVar55._12_4_ = 0x39506967;
          auVar55._16_4_ = 0x39506967;
          auVar55._20_4_ = 0x39506967;
          auVar55._24_4_ = 0x39506967;
          auVar55._28_4_ = 0x39506967;
          auVar68 = vfmadd213ps_fma(auVar55,auVar34,auVar32);
          auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar34,auVar67);
          auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),auVar34,auVar81);
          auVar61._8_4_ = 0x3e2aaaaa;
          auVar61._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar61._12_4_ = 0x3e2aaaaa;
          auVar61._16_4_ = 0x3e2aaaaa;
          auVar61._20_4_ = 0x3e2aaaaa;
          auVar61._24_4_ = 0x3e2aaaaa;
          auVar61._28_4_ = 0x3e2aaaaa;
          auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar28),auVar61);
          auVar68 = vfmadd213ps_fma(ZEXT1632(auVar68),ZEXT1632(auVar28),auVar70);
          auVar34 = ZEXT1632(auVar68);
          auVar35._0_4_ = auVar43._0_4_ + fVar1;
          auVar35._4_4_ = auVar43._4_4_ + fVar2;
          auVar35._8_4_ = auVar43._8_4_ + fVar3;
          auVar35._12_4_ = auVar43._12_4_ + fVar4;
          auVar35._16_4_ = auVar43._16_4_ + 0.0;
          auVar35._20_4_ = auVar43._20_4_ + 0.0;
          auVar35._24_4_ = auVar43._24_4_ + 0.0;
          auVar35._28_4_ = auVar43._28_4_ + 0.0;
          auVar68 = vfmadd231ps_fma(auVar35,auVar5,ZEXT1632(auVar68));
          auVar40._0_4_ = (int)auVar72._0_4_;
          auVar40._4_4_ = (int)auVar72._4_4_;
          auVar40._8_4_ = (int)auVar72._8_4_;
          auVar40._12_4_ = (int)auVar72._12_4_;
          auVar40._16_4_ = (int)auVar72._16_4_;
          auVar40._20_4_ = (int)auVar72._20_4_;
          auVar40._24_4_ = (int)auVar72._24_4_;
          auVar40._28_4_ = (int)auVar72._28_4_;
          auVar41 = vpslld_avx2(auVar40,0x17);
          auVar7._8_4_ = 0x3f800000;
          auVar7._0_8_ = 0x3f8000003f800000;
          auVar7._12_4_ = 0x3f800000;
          auVar7._16_4_ = 0x3f800000;
          auVar7._20_4_ = 0x3f800000;
          auVar7._24_4_ = 0x3f800000;
          auVar7._28_4_ = 0x3f800000;
          auVar41 = vpaddd_avx2(auVar41,auVar7);
          auVar68 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar68),auVar43._0_32_);
          auVar41 = vrcpps_avx(ZEXT1632(auVar68));
          auVar6._4_4_ = auVar58._4_4_ * auVar41._4_4_;
          auVar6._0_4_ = auVar58._0_4_ * auVar41._0_4_;
          auVar6._8_4_ = auVar58._8_4_ * auVar41._8_4_;
          auVar6._12_4_ = auVar58._12_4_ * auVar41._12_4_;
          auVar6._16_4_ = auVar58._16_4_ * auVar41._16_4_;
          auVar6._20_4_ = auVar58._20_4_ * auVar41._20_4_;
          auVar6._24_4_ = auVar58._24_4_ * auVar41._24_4_;
          auVar6._28_4_ = auVar20._28_4_;
          auVar68 = vfmsub213ps_fma(ZEXT1632(auVar68),auVar6,auVar58);
          auVar68 = vfnmadd213ps_fma(ZEXT1632(auVar68),auVar41,auVar6);
          *pauVar15 = ZEXT1632(auVar68);
          pauVar15 = pauVar15 + 1;
          iVar8 = iVar8 + 8;
          uVar12 = uVar13 & 0xfffffff8;
        } while (iVar8 < (int)uVar13);
      }
      auVar68._8_4_ = 0xc2b0c0a5;
      auVar68._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar68._12_4_ = 0xc2b0c0a5;
      auVar28._8_4_ = 0x3fb8aa3b;
      auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar28._12_4_ = 0x3fb8aa3b;
      auVar25._8_4_ = 0x3f000000;
      auVar25._0_8_ = 0x3f0000003f000000;
      auVar25._12_4_ = 0x3f000000;
      auVar53._8_4_ = 0x3f800000;
      auVar53._0_8_ = 0x3f8000003f800000;
      auVar53._12_4_ = 0x3f800000;
      auVar52._8_4_ = 0xbf317218;
      auVar52._0_8_ = 0xbf317218bf317218;
      auVar52._12_4_ = 0xbf317218;
      auVar77._8_4_ = 0x39506967;
      auVar77._0_8_ = 0x3950696739506967;
      auVar77._12_4_ = 0x39506967;
      auVar87._8_4_ = 0x3ab743ce;
      auVar87._0_8_ = 0x3ab743ce3ab743ce;
      auVar87._12_4_ = 0x3ab743ce;
      uVar10 = uVar12 | 3;
      while ((int)uVar10 < (int)uVar13) {
        auVar17 = *(undefined1 (*) [16])*pauVar15;
        auVar38._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
        auVar38._8_4_ = -auVar17._8_4_;
        auVar38._12_4_ = -auVar17._12_4_;
        auVar36._8_4_ = 0x42b0c0a5;
        auVar36._0_8_ = 0x42b0c0a542b0c0a5;
        auVar36._12_4_ = 0x42b0c0a5;
        auVar38 = vminps_avx(auVar38,auVar36);
        auVar29 = vmaxps_avx(auVar68,auVar38);
        auVar38 = vfmadd213ps_fma(auVar28,auVar29,auVar25);
        auVar47._0_4_ = (int)auVar38._0_4_;
        auVar47._4_4_ = (int)auVar38._4_4_;
        auVar47._8_4_ = (int)auVar38._8_4_;
        auVar47._12_4_ = (int)auVar38._12_4_;
        auVar36 = vcvtdq2ps_avx(auVar47);
        auVar38 = vcmpps_avx(auVar38,auVar36,1);
        auVar38 = vandps_avx(auVar53,auVar38);
        auVar38 = vsubps_avx(auVar36,auVar38);
        auVar29 = vfmadd231ps_fma(auVar29,auVar38,auVar52);
        fVar1 = auVar29._0_4_;
        auVar48._0_4_ = fVar1 * fVar1;
        fVar2 = auVar29._4_4_;
        auVar48._4_4_ = fVar2 * fVar2;
        fVar3 = auVar29._8_4_;
        auVar48._8_4_ = fVar3 * fVar3;
        fVar4 = auVar29._12_4_;
        auVar48._12_4_ = fVar4 * fVar4;
        auVar36 = vfmadd213ps_fma(auVar77,auVar29,auVar87);
        auVar63._8_4_ = 0x3c088908;
        auVar63._0_8_ = 0x3c0889083c088908;
        auVar63._12_4_ = 0x3c088908;
        auVar36 = vfmadd213ps_fma(auVar36,auVar29,auVar63);
        auVar64._8_4_ = 0x3d2aa9c1;
        auVar64._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar64._12_4_ = 0x3d2aa9c1;
        auVar36 = vfmadd213ps_fma(auVar36,auVar29,auVar64);
        auVar65._8_4_ = 0x3e2aaaaa;
        auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar65._12_4_ = 0x3e2aaaaa;
        auVar36 = vfmadd213ps_fma(auVar36,auVar29,auVar65);
        auVar36 = vfmadd213ps_fma(auVar36,auVar29,auVar25);
        auVar34 = ZEXT1632(auVar36);
        auVar29._0_4_ = fVar1 + 1.0;
        auVar29._4_4_ = fVar2 + 1.0;
        auVar29._8_4_ = fVar3 + 1.0;
        auVar29._12_4_ = fVar4 + 1.0;
        auVar36 = vfmadd231ps_fma(auVar29,auVar48,auVar36);
        auVar37._0_4_ = (int)auVar38._0_4_;
        auVar37._4_4_ = (int)auVar38._4_4_;
        auVar37._8_4_ = (int)auVar38._8_4_;
        auVar37._12_4_ = (int)auVar38._12_4_;
        auVar38 = vpslld_avx(auVar37,0x17);
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar38 = vpaddd_avx(auVar38,auVar49);
        auVar36 = vfmadd213ps_fma(auVar38,auVar36,auVar53);
        auVar38 = vrcpps_avx(auVar36);
        auVar50._0_4_ = auVar17._0_4_ * auVar38._0_4_;
        auVar50._4_4_ = auVar17._4_4_ * auVar38._4_4_;
        auVar50._8_4_ = auVar17._8_4_ * auVar38._8_4_;
        auVar50._12_4_ = auVar17._12_4_ * auVar38._12_4_;
        auVar17 = vfmsub213ps_fma(auVar36,auVar50,auVar17);
        auVar17 = vfnmadd213ps_fma(auVar17,auVar38,auVar50);
        *(undefined1 (*) [16])*pauVar15 = auVar17;
        pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
        uVar10 = uVar12 + 7;
        uVar12 = uVar12 + 4;
      }
      auVar58 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar34 = vpcmpeqd_avx2(auVar34,auVar34);
      in_ZMM4 = ZEXT3264(auVar34);
      if ((int)uVar12 < (int)uVar13) {
        uVar12 = ~uVar12 + uVar13;
        auVar18._8_4_ = uVar12;
        auVar18._0_8_ = CONCAT44(0,uVar12);
        auVar18._12_4_ = 0;
        auVar18._16_4_ = uVar12;
        auVar18._20_4_ = 0;
        auVar18._24_4_ = uVar12;
        auVar18._28_4_ = 0;
        uVar16 = 0;
        do {
          auVar19._8_8_ = uVar16;
          auVar19._0_8_ = uVar16;
          auVar19._16_8_ = uVar16;
          auVar19._24_8_ = uVar16;
          auVar41 = vpor_avx2(auVar19,_DAT_00314140);
          auVar42._8_8_ = 0x8000000000000000;
          auVar42._0_8_ = 0x8000000000000000;
          auVar42._16_8_ = 0x8000000000000000;
          auVar42._24_8_ = 0x8000000000000000;
          auVar34 = vpor_avx2(auVar19,auVar58);
          auVar58 = vpor_avx2(auVar42,auVar18);
          auVar34 = vpcmpgtq_avx2(auVar34 ^ auVar42,auVar58);
          auVar58 = vpcmpgtq_avx2(auVar41 ^ auVar42,auVar58);
          auVar34 = vpackssdw_avx2(auVar58,auVar34);
          auVar34 = auVar34 ^ in_ZMM4._0_32_;
          auVar68 = vpackssdw_avx(auVar34._0_16_,auVar34._16_16_);
          auVar68 = vpshufd_avx(auVar68,0xd8);
          auVar34 = vpmovzxwd_avx2(auVar68);
          auVar20 = vpslld_avx2(auVar34,0x1f);
          auVar41 = vmaskmovps_avx(auVar20,*(undefined1 (*) [32])(*pauVar15 + uVar16 * 4));
          auVar17._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
          auVar17._8_4_ = -auVar41._8_4_;
          auVar17._12_4_ = -auVar41._12_4_;
          auVar21._16_4_ = -auVar41._16_4_;
          auVar21._0_16_ = auVar17;
          auVar21._20_4_ = -auVar41._20_4_;
          auVar21._24_4_ = -auVar41._24_4_;
          auVar21._28_4_ = auVar41._28_4_ ^ 0x80000000;
          auVar25 = auVar21._16_16_;
          auVar53 = in_ZMM4._0_16_;
          local_148._0_4_ = expf(auVar21._16_4_);
          local_148._4_4_ = extraout_XMM0_Db;
          local_148._8_4_ = extraout_XMM0_Dc;
          local_148._12_4_ = extraout_XMM0_Dd;
          auVar68 = vpermilps_avx(auVar25,0xf5);
          auVar43._0_4_ = expf(auVar68._0_4_);
          auVar43._4_60_ = extraout_var;
          auVar68 = vinsertps_avx(local_148,auVar43._0_16_,0x10);
          auVar28 = vpermilps_avx(auVar25,0x4e);
          auVar56._0_4_ = expf(auVar28._0_4_);
          auVar56._4_60_ = extraout_var_00;
          auVar68 = vinsertps_avx(auVar68,auVar56._0_16_,0x20);
          auVar28 = vpermilps_avx(auVar25,0xff);
          auVar80._0_4_ = expf(auVar28._0_4_);
          auVar80._4_60_ = extraout_var_01;
          auVar68 = vinsertps_avx(auVar68,auVar80._0_16_,0x30);
          local_108 = (float)auVar17._0_8_;
          auVar45 = (undefined1  [36])0x0;
          auVar34 = ZEXT1632(auVar53);
          local_148._0_4_ = expf(local_108);
          local_148._4_4_ = extraout_XMM0_Db_00;
          local_148._8_4_ = extraout_XMM0_Dc_00;
          local_148._12_4_ = extraout_XMM0_Dd_00;
          auVar28 = vpermilps_avx(auVar17,0xf5);
          auVar88._0_4_ = expf(auVar28._0_4_);
          auVar88._4_60_ = extraout_var_02;
          auVar28 = vinsertps_avx(local_148,auVar88._0_16_,0x10);
          auVar25 = vpermilps_avx(auVar17,0x4e);
          auVar23._0_4_ = expf(auVar25._0_4_);
          auVar23._4_60_ = extraout_var_03;
          auVar28 = vinsertps_avx(auVar28,auVar23._0_16_,0x20);
          auVar25 = vpermilps_avx(auVar17,0xff);
          auVar24._0_4_ = expf(auVar25._0_4_);
          auVar24._4_60_ = extraout_var_04;
          auVar34 = vpcmpeqd_avx2(auVar34,auVar34);
          in_ZMM4 = ZEXT3264(auVar34);
          auVar58 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar43 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar28 = vinsertps_avx(auVar28,auVar24._0_16_,0x30);
          auVar22._0_4_ = auVar28._0_4_ + 1.0;
          auVar22._4_4_ = auVar28._4_4_ + 1.0;
          auVar22._8_4_ = auVar28._8_4_ + 1.0;
          auVar22._12_4_ = auVar28._12_4_ + 1.0;
          auVar22._16_4_ = auVar68._0_4_ + 1.0;
          auVar22._20_4_ = auVar68._4_4_ + 1.0;
          auVar22._24_4_ = auVar68._8_4_ + 1.0;
          auVar22._28_4_ = auVar68._12_4_ + 1.0;
          auVar34 = vrcpps_avx(auVar22);
          auVar44._0_4_ = auVar41._0_4_ * auVar34._0_4_;
          auVar44._4_4_ = auVar41._4_4_ * auVar34._4_4_;
          auVar44._8_4_ = auVar41._8_4_ * auVar34._8_4_;
          auVar44._12_4_ = auVar41._12_4_ * auVar34._12_4_;
          auVar44._16_4_ = auVar41._16_4_ * auVar34._16_4_;
          auVar44._20_4_ = auVar41._20_4_ * auVar34._20_4_;
          auVar44._24_4_ = auVar41._24_4_ * auVar34._24_4_;
          auVar44._28_36_ = auVar45;
          auVar68 = vfmsub213ps_fma(auVar22,auVar44._0_32_,auVar41);
          auVar68 = vfnmadd213ps_fma(ZEXT1632(auVar68),auVar34,auVar44._0_32_);
          auVar34 = vmaskmovps_avx(auVar20,ZEXT1632(auVar68));
          *(undefined1 (*) [32])(*pauVar15 + uVar16 * 4) = auVar34;
          uVar16 = uVar16 + 8;
        } while ((CONCAT44(0,uVar12) + 8 & 0xfffffffffffffff8) != uVar16);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar14);
  }
  return 0;
}

Assistant:

int Swish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, swish_avx(_p));
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, swish_sse(_p));
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, swish_avx(_p));
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _mm_storeu_ps(ptr, swish_sse(_p));
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}